

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O0

void __thiscall
AstWalker::visitObjectDeclarationExpressionAstNode
          (AstWalker *this,ObjectDeclarationExpressionAstNode *node)

{
  bool bVar1;
  reference ppVar2;
  element_type *peVar3;
  pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_> *kv;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
  *__range1;
  ObjectDeclarationExpressionAstNode *node_local;
  AstWalker *this_local;
  
  (*this->_vptr_AstWalker[0x20])(this,node);
  __end1 = std::
           vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
           ::begin(&node->keyValues);
  kv = (pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_> *)
       std::
       vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
       ::end(&node->keyValues);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_*,_std::vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>_>
                                *)&kv);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_*,_std::vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>_>
             ::operator*(&__end1);
    peVar3 = std::__shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(ppVar2->second).
                         super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>);
    (*this->_vptr_AstWalker[3])(this,peVar3);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_*,_std::vector<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>_>
    ::operator++(&__end1);
  }
  (*this->_vptr_AstWalker[0x2f])(this,node);
  return;
}

Assistant:

void AstWalker::visitObjectDeclarationExpressionAstNode(ObjectDeclarationExpressionAstNode* node) noexcept {
  this->onEnterObjectDeclarationExpressionAstNode(node);
  for (auto & kv : node->keyValues) {
    this->visitExpressionAstNode(kv.second.get());
  }
  this->onExitObjectDeclarationExpressionAstNode(node);
}